

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O1

char * parse_headers(char *buf,char *buf_end,phr_header *headers,size_t *num_headers,
                    size_t max_headers,int *ret)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  size_t value_len;
  char *value;
  size_t local_40;
  char *local_38;
  
  if (buf != buf_end) {
    do {
      cVar1 = *buf;
      if (cVar1 == '\n') {
        return buf + 1;
      }
      if (cVar1 == '\r') {
        if (buf + 1 != buf_end) {
          if (buf[1] == '\n') {
            return buf + 2;
          }
LAB_0010bd4d:
          *ret = -1;
          return (char *)0x0;
        }
        break;
      }
      sVar4 = *num_headers;
      if (sVar4 == max_headers) goto LAB_0010bd4d;
      if ((sVar4 == 0) || ((cVar1 != '\t' && (cVar1 != ' ')))) {
        sVar3 = 0;
        do {
          if ((ulong)(byte)buf[sVar3] == 0x3a) {
            headers[sVar4].name = buf;
            headers[sVar4].name_len = sVar3;
            buf = buf + sVar3;
            goto LAB_0010bc7a;
          }
          if (""[(byte)buf[sVar3]] == '\0') {
            *ret = -1;
            goto LAB_0010bc78;
          }
          lVar2 = sVar3 + 1;
          sVar3 = sVar3 + 1;
        } while (buf + lVar2 != buf_end);
        *ret = -2;
LAB_0010bc78:
        buf = (char *)0x0;
LAB_0010bc7a:
        if (buf == (char *)0x0) {
          return (char *)0x0;
        }
        if (headers[*num_headers].name_len == 0) goto LAB_0010bd4d;
        do {
          buf = buf + 1;
          if (buf == buf_end) goto LAB_0010bd36;
        } while ((*buf == ' ') || (*buf == '\t'));
      }
      else {
        headers[sVar4].name = (char *)0x0;
        headers[sVar4].name_len = 0;
      }
      buf = get_token_to_eol(buf,buf_end,&local_38,&local_40,ret);
      if (buf == (char *)0x0) {
        return (char *)0x0;
      }
      sVar4 = local_40;
      if (local_40 == 0) {
LAB_0010bcf5:
        pcVar5 = local_38 + sVar4;
      }
      else {
        do {
          if ((local_38[sVar4 - 1] != ' ') && (local_38[sVar4 - 1] != '\t')) goto LAB_0010bcf5;
          sVar4 = sVar4 - 1;
          pcVar5 = local_38;
        } while (sVar4 != 0);
      }
      sVar4 = *num_headers;
      headers[sVar4].value = local_38;
      headers[sVar4].value_len = (long)pcVar5 - (long)local_38;
      if (buf == (char *)0x0) {
        return (char *)0x0;
      }
      *num_headers = *num_headers + 1;
    } while (buf != buf_end);
  }
LAB_0010bd36:
  *ret = -2;
  return (char *)0x0;
}

Assistant:

static const char *parse_headers(const char *buf, const char *buf_end, struct phr_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret)
{
    for (;; ++*num_headers) {
        CHECK_EOF();
        if (*buf == '\015') {
            ++buf;
            EXPECT_CHAR('\012');
            break;
        } else if (*buf == '\012') {
            ++buf;
            break;
        }
        if (*num_headers == max_headers) {
            *ret = -1;
            return NULL;
        }
        if (!(*num_headers != 0 && (*buf == ' ' || *buf == '\t'))) {
            /* parsing name, but do not discard SP before colon, see
             * http://www.mozilla.org/security/announce/2006/mfsa2006-33.html */
            if ((buf = parse_token(buf, buf_end, &headers[*num_headers].name, &headers[*num_headers].name_len, ':', ret)) == NULL) {
                return NULL;
            }
            if (headers[*num_headers].name_len == 0) {
                *ret = -1;
                return NULL;
            }
            ++buf;
            for (;; ++buf) {
                CHECK_EOF();
                if (!(*buf == ' ' || *buf == '\t')) {
                    break;
                }
            }
        } else {
            headers[*num_headers].name = NULL;
            headers[*num_headers].name_len = 0;
        }
        const char *value;
        size_t value_len;
        if ((buf = get_token_to_eol(buf, buf_end, &value, &value_len, ret)) == NULL) {
            return NULL;
        }
        /* remove trailing SPs and HTABs */
        const char *value_end = value + value_len;
        for (; value_end != value; --value_end) {
            const char c = *(value_end - 1);
            if (!(c == ' ' || c == '\t')) {
                break;
            }
        }
        headers[*num_headers].value = value;
        headers[*num_headers].value_len = value_end - value;
    }
    return buf;
}